

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

ostream * operator<<(ostream *os,BigInt *x)

{
  string local_30;
  
  BigInt::to_string_abi_cxx11_(&local_30,x);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, BigInt& x) {
    os << x.to_string();
    return os;
}